

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O1

int aom_noise_data_validate(double *data,int w,int h)

{
  int iVar1;
  void *memblk;
  void *memblk_00;
  void *memblk_01;
  void *memblk_02;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  memblk = aom_calloc((long)w,8);
  memblk_00 = aom_calloc((long)w,8);
  memblk_01 = aom_calloc((long)h,8);
  memblk_02 = aom_calloc((long)h,8);
  auVar6._0_4_ = -(uint)((int)memblk == 0 && (int)((ulong)memblk >> 0x20) == 0);
  auVar6._4_4_ = -(uint)((int)memblk_00 == 0 && (int)((ulong)memblk_00 >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)memblk_01 == 0 && (int)((ulong)memblk_01 >> 0x20) == 0);
  auVar6._12_4_ = -(uint)((int)memblk_02 == 0 && (int)((ulong)memblk_02 >> 0x20) == 0);
  iVar1 = movmskps((int)memblk_02,auVar6);
  if (iVar1 == 0) {
    uVar3 = (ulong)(uint)w;
    if (h < 1) {
      dVar10 = 0.0;
      dVar9 = 0.0;
    }
    else {
      dVar9 = 0.0;
      uVar2 = 0;
      dVar10 = 0.0;
      do {
        if (0 < w) {
          uVar4 = 0;
          do {
            dVar8 = data[uVar4];
            dVar7 = dVar8 * dVar8;
            *(double *)((long)memblk_00 + uVar4 * 8) =
                 *(double *)((long)memblk_00 + uVar4 * 8) + dVar7;
            dVar9 = dVar9 + dVar7;
            *(double *)((long)memblk_02 + uVar2 * 8) =
                 dVar7 + *(double *)((long)memblk_02 + uVar2 * 8);
            *(double *)((long)memblk + uVar4 * 8) = *(double *)((long)memblk + uVar4 * 8) + dVar8;
            dVar10 = dVar10 + dVar8;
            *(double *)((long)memblk_01 + uVar2 * 8) =
                 dVar8 + *(double *)((long)memblk_01 + uVar2 * 8);
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        uVar2 = uVar2 + 1;
        data = data + uVar3;
      } while (uVar2 != (uint)h);
    }
    dVar10 = dVar10 / (double)(h * w);
    dVar9 = dVar9 / (double)(h * w) - dVar10 * dVar10;
    iVar1 = 1;
    if (0 < h) {
      uVar2 = 0;
      do {
        dVar8 = *(double *)((long)memblk_01 + uVar2 * 8) / (double)h;
        *(double *)((long)memblk_01 + uVar2 * 8) = dVar8;
        dVar8 = *(double *)((long)memblk_02 + uVar2 * 8) / (double)h - dVar8 * dVar8;
        *(double *)((long)memblk_02 + uVar2 * 8) = dVar8;
        if (2.0 <= ABS(dVar8 - dVar9)) {
          pcVar5 = "Variance distance too large %f %f\n";
LAB_002a8ae7:
          fprintf(_stderr,pcVar5);
          iVar1 = 0;
          break;
        }
        if (2.0 <= ABS(*(double *)((long)memblk_01 + uVar2 * 8) - dVar10)) {
          pcVar5 = "Mean distance too large %f %f\n";
          goto LAB_002a8ae7;
        }
        uVar2 = uVar2 + 1;
      } while ((uint)h != uVar2);
    }
    if (0 < w) {
      uVar2 = 0;
      do {
        dVar8 = *(double *)((long)memblk + uVar2 * 8) / (double)w;
        *(double *)((long)memblk + uVar2 * 8) = dVar8;
        dVar8 = *(double *)((long)memblk_00 + uVar2 * 8) / (double)w - dVar8 * dVar8;
        *(double *)((long)memblk_00 + uVar2 * 8) = dVar8;
        if (2.0 <= ABS(dVar8 - dVar9)) {
          pcVar5 = "Variance distance too large %f %f\n";
LAB_002a8b24:
          fprintf(_stderr,pcVar5);
          iVar1 = 0;
          break;
        }
        if (2.0 <= ABS(*(double *)((long)memblk + uVar2 * 8) - dVar10)) {
          pcVar5 = "Mean distance too large %f %f\n";
          goto LAB_002a8b24;
        }
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    aom_free(memblk);
    aom_free(memblk_01);
    aom_free(memblk_00);
    aom_free(memblk_02);
  }
  else {
    aom_free(memblk);
    aom_free(memblk_01);
    aom_free(memblk_00);
    aom_free(memblk_02);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int aom_noise_data_validate(const double *data, int w, int h) {
  const double kVarianceThreshold = 2;
  const double kMeanThreshold = 2;

  int x = 0, y = 0;
  int ret_value = 1;
  double var = 0, mean = 0;
  double *mean_x, *mean_y, *var_x, *var_y;

  // Check that noise variance is not increasing in x or y
  // and that the data is zero mean.
  mean_x = (double *)aom_calloc(w, sizeof(*mean_x));
  var_x = (double *)aom_calloc(w, sizeof(*var_x));
  mean_y = (double *)aom_calloc(h, sizeof(*mean_x));
  var_y = (double *)aom_calloc(h, sizeof(*var_y));
  if (!(mean_x && var_x && mean_y && var_y)) {
    aom_free(mean_x);
    aom_free(mean_y);
    aom_free(var_x);
    aom_free(var_y);
    return 0;
  }

  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      const double d = data[y * w + x];
      var_x[x] += d * d;
      var_y[y] += d * d;
      mean_x[x] += d;
      mean_y[y] += d;
      var += d * d;
      mean += d;
    }
  }
  mean /= (w * h);
  var = var / (w * h) - mean * mean;

  for (y = 0; y < h; ++y) {
    mean_y[y] /= h;
    var_y[y] = var_y[y] / h - mean_y[y] * mean_y[y];
    if (fabs(var_y[y] - var) >= kVarianceThreshold) {
      fprintf(stderr, "Variance distance too large %f %f\n", var_y[y], var);
      ret_value = 0;
      break;
    }
    if (fabs(mean_y[y] - mean) >= kMeanThreshold) {
      fprintf(stderr, "Mean distance too large %f %f\n", mean_y[y], mean);
      ret_value = 0;
      break;
    }
  }

  for (x = 0; x < w; ++x) {
    mean_x[x] /= w;
    var_x[x] = var_x[x] / w - mean_x[x] * mean_x[x];
    if (fabs(var_x[x] - var) >= kVarianceThreshold) {
      fprintf(stderr, "Variance distance too large %f %f\n", var_x[x], var);
      ret_value = 0;
      break;
    }
    if (fabs(mean_x[x] - mean) >= kMeanThreshold) {
      fprintf(stderr, "Mean distance too large %f %f\n", mean_x[x], mean);
      ret_value = 0;
      break;
    }
  }

  aom_free(mean_x);
  aom_free(mean_y);
  aom_free(var_x);
  aom_free(var_y);

  return ret_value;
}